

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_timer.cpp
# Opt level: O3

void I_FreezeTimePolled(bool frozen)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  undefined7 in_register_00000039;
  
  iVar2 = TicFrozen;
  if ((int)CONCAT71(in_register_00000039,frozen) == 0) {
    if (TicFrozen == 0) {
      __assert_fail("TicFrozen != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/posix/sdl/i_timer.cpp"
                    ,0x71,"void I_FreezeTimePolled(bool)");
    }
    TicFrozen = 0;
    iVar3 = SDL_GetTicks();
    auVar1 = SEXT816((long)(int)(iVar3 - BaseTime) * 0x23) * SEXT816(0x20c49ba5e353f7cf);
    BaseTime = ((((int)(auVar1._8_8_ >> 7) - (auVar1._12_4_ >> 0x1f)) - iVar2) * 1000) / 0x23 +
               BaseTime;
  }
  else {
    if (TicFrozen != 0) {
      __assert_fail("TicFrozen == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/posix/sdl/i_timer.cpp"
                    ,0x6c,"void I_FreezeTimePolled(bool)");
    }
    iVar2 = SDL_GetTicks();
    auVar1 = SEXT816((long)(int)(iVar2 - BaseTime) * 0x23) * SEXT816(0x20c49ba5e353f7cf);
    TicFrozen = (int)(auVar1._8_8_ >> 7) - (auVar1._12_4_ >> 0x1f);
  }
  return;
}

Assistant:

void I_FreezeTimePolled (bool frozen)
{
	if (frozen)
	{
		assert(TicFrozen == 0);
		TicFrozen = I_GetTimePolled(false);
	}
	else
	{
		assert(TicFrozen != 0);
		int froze = TicFrozen;
		TicFrozen = 0;
		int now = I_GetTimePolled(false);
		BaseTime += (now - froze) * 1000 / TICRATE;
	}
}